

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo3.cpp
# Opt level: O0

int64_t anon_unknown.dwarf_be0bd::S2
                  (int64_t x,int64_t y,int64_t c,vector<int,_std::allocator<int>_> *primes,
                  vector<int,_std::allocator<int>_> *lpf,vector<int,_std::allocator<int>_> *mu)

{
  int256_t res;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  long *plVar4;
  size_type *psVar5;
  reference pvVar6;
  long lVar7;
  vector<int,_std::allocator<int>_> *in_RCX;
  long in_RDX;
  size_type in_RSI;
  string *in_RDI;
  vector<int,_std::allocator<int>_> *in_R8;
  vector<int,_std::allocator<int>_> *in_R9;
  int64_t stop_1;
  int64_t xn_1;
  int64_t i_1;
  int64_t min_m_1;
  int64_t l;
  int64_t prime_1;
  int64_t stop;
  int64_t xn;
  int64_t m;
  int64_t i;
  int64_t max_m;
  int64_t min_m;
  int64_t prime;
  int64_t b;
  int64_t high;
  int64_t low;
  int64_t pi_y;
  int64_t pi_sqrty;
  int64_t S2_result;
  vector<long,_std::allocator<long>_> phi;
  vector<int,_std::allocator<int>_> pi;
  Wheel wheel;
  BitSieve sieve;
  int64_t segment_size;
  int64_t limit;
  double time;
  uint64_t in_stack_fffffffffffffc38;
  BitSieve *in_stack_fffffffffffffc40;
  allocator_type *in_stack_fffffffffffffc48;
  WheelItem *in_stack_fffffffffffffc50;
  size_type in_stack_fffffffffffffc58;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffc60;
  size_t in_stack_fffffffffffffc68;
  BitSieve *in_stack_fffffffffffffc70;
  char *in_stack_fffffffffffffc78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc80;
  int64_t in_stack_fffffffffffffca8;
  int64_t in_stack_fffffffffffffcb0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffcb8;
  undefined7 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc8;
  string *in_stack_fffffffffffffcd0;
  int64_t in_stack_fffffffffffffcd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  long in_stack_fffffffffffffce8;
  size_type *in_stack_fffffffffffffcf0;
  BitSieve *in_stack_fffffffffffffcf8;
  uint64_t in_stack_fffffffffffffd30;
  uint64_t in_stack_fffffffffffffd38;
  BitSieve *in_stack_fffffffffffffd40;
  undefined1 local_258 [47];
  allocator<char> local_229;
  string local_228 [32];
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  size_type local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  long local_1d0;
  long local_1c8;
  size_type local_1c0;
  long local_1b8;
  long local_1b0;
  size_type local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  size_type local_180;
  long local_178;
  char *local_170;
  BitSieve *local_168;
  long local_160;
  long local_158;
  long local_150;
  undefined8 local_140;
  vector<long,_std::allocator<long>_> local_138;
  vector<int,_std::allocator<int>_> local_120 [3];
  long local_d0;
  long local_c8;
  double local_c0;
  allocator<char> local_b1;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [55];
  allocator<char> local_51;
  string local_50 [32];
  vector<int,_std::allocator<int>_> *local_30;
  vector<int,_std::allocator<int>_> *local_28;
  vector<int,_std::allocator<int>_> *local_20;
  long local_18;
  size_type local_10;
  string *local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
             (allocator<char> *)in_stack_fffffffffffffc70);
  primesum::print((string *)0x146037);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
             (allocator<char> *)in_stack_fffffffffffffc70);
  primesum::print((string *)0x146093);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
             (allocator<char> *)in_stack_fffffffffffffc70);
  primesum::print((string *)0x1460ef);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  local_c0 = primesum::get_time();
  local_c8 = (long)local_8 / (long)local_10 + 1;
  primesum::isqrt<long>((long)in_stack_fffffffffffffc40);
  local_d0 = primesum::next_power_of_2<long>((long)in_stack_fffffffffffffc48);
  primesum::BitSieve::BitSieve(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  std::vector<int,_std::allocator<int>_>::size(local_20);
  primesum::Wheel::Wheel<std::vector<int,std::allocator<int>>>
            ((Wheel *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0),
             in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  primesum::generate_pi(in_stack_fffffffffffffcd8);
  std::vector<int,_std::allocator<int>_>::size(local_20);
  local_140 = 0;
  std::allocator<long>::allocator((allocator<long> *)0x1461ec);
  std::vector<long,_std::allocator<long>_>::vector
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
             &in_stack_fffffffffffffc50->next_multiple,in_stack_fffffffffffffc48);
  std::allocator<long>::~allocator((allocator<long> *)0x146220);
  local_150 = 0;
  sVar2 = primesum::isqrt<long>((long)in_stack_fffffffffffffc40);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_120,sVar2);
  local_158 = (long)*pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_120,local_10);
  local_160 = (long)*pvVar3;
  local_168 = (BitSieve *)0x1;
  do {
    if (local_c8 <= (long)local_168) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                 (allocator<char> *)in_stack_fffffffffffffc70);
      primesum::int256_t::int256_t<long,void>((int256_t *)local_258,local_150);
      res.low._8_8_ = in_stack_fffffffffffffce8;
      res.low._0_8_ = in_stack_fffffffffffffce0;
      res.high._0_8_ = in_stack_fffffffffffffcf0;
      res.high._8_8_ = in_stack_fffffffffffffcf8;
      primesum::print(in_stack_fffffffffffffcd0,res,(double)in_stack_fffffffffffffcc8);
      std::__cxx11::string::~string(local_228);
      std::allocator<char>::~allocator(&local_229);
      lVar7 = local_150;
      std::vector<long,_std::allocator<long>_>::~vector
                ((vector<long,_std::allocator<long>_> *)local_258._24_8_);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_258._24_8_);
      primesum::Wheel::~Wheel((Wheel *)0x146dcc);
      primesum::BitSieve::~BitSieve((BitSieve *)0x146dd9);
      return lVar7;
    }
    local_178 = (long)&(local_168->sieve_).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start + local_d0;
    plVar4 = std::min<long>(&local_178,&local_c8);
    local_170 = (char *)*plVar4;
    local_180 = local_18 + 1;
    primesum::BitSieve::pre_sieve
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    for (; (long)local_180 < local_158; local_180 = local_180 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_20,local_180);
      local_188 = (long)*pvVar3;
      local_198 = (long)local_8 / (local_188 * (long)local_170);
      local_1a0 = (long)local_10 / local_188;
      plVar4 = std::max<long>(&local_198,&local_1a0);
      local_190 = *plVar4;
      local_1b0 = (long)local_8 / (local_188 * (long)local_168);
      psVar5 = (size_type *)std::min<long>(&local_1b0,(long *)&local_10);
      local_1a8 = *psVar5;
      local_1b8 = 0;
      sVar2 = local_1a8;
      if ((long)local_1a8 <= local_188) goto LAB_00146ce9;
      while (local_1c0 = sVar2, local_190 < (long)local_1c0) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_30,local_1c0);
        lVar7 = local_188;
        if ((*pvVar3 != 0) &&
           (pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_28,local_1c0),
           lVar7 < *pvVar3)) {
          local_1c8 = (long)local_8 / (long)(local_188 * local_1c0);
          local_1d0 = local_1c8 - (long)local_168;
          for (; local_1b8 <= local_1d0; local_1b8 = local_1b8 + 2) {
            in_stack_fffffffffffffd40 =
                 (BitSieve *)
                 ((long)&(local_168->sieve_).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start + local_1b8);
            bVar1 = primesum::BitSieve::operator[]
                              (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
            in_stack_fffffffffffffd38 = (long)in_stack_fffffffffffffd40 * (ulong)bVar1;
            pvVar6 = std::vector<long,_std::allocator<long>_>::operator[](&local_138,local_180);
            *pvVar6 = in_stack_fffffffffffffd38 + *pvVar6;
          }
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_30,local_1c0);
          in_stack_fffffffffffffd30 = (long)*pvVar3 * local_1c0 * local_188;
          pvVar6 = std::vector<long,_std::allocator<long>_>::operator[](&local_138,local_180);
          local_150 = local_150 - in_stack_fffffffffffffd30 * *pvVar6;
        }
        sVar2 = local_1c0 - 1;
      }
      for (; local_1b8 < (long)local_170 - (long)local_168; local_1b8 = local_1b8 + 2) {
        lVar7 = (long)&(local_168->sieve_).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start + local_1b8;
        bVar1 = primesum::BitSieve::operator[](in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
        pvVar6 = std::vector<long,_std::allocator<long>_>::operator[](&local_138,local_180);
        *pvVar6 = lVar7 * (ulong)bVar1 + *pvVar6;
      }
      in_stack_fffffffffffffcf8 = local_168;
      primesum::Wheel::operator[]((Wheel *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      cross_off(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                (int64_t)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                in_stack_fffffffffffffc50);
    }
    for (; (long)local_180 < local_160; local_180 = local_180 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_20,local_180);
      local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(long)*pvVar3
      ;
      local_1e8 = (long)local_8 / ((long)local_1d8 * (long)local_168);
      in_stack_fffffffffffffcf0 = (size_type *)std::min<long>(&local_1e8,(long *)&local_10);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         (local_120,*in_stack_fffffffffffffcf0);
      local_1e0 = (size_type)*pvVar3;
      in_stack_fffffffffffffce0 = local_1d8;
      in_stack_fffffffffffffce8 =
           primesum::max<long>((long)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,0x1469be);
      local_1f8 = 0;
      pbVar8 = local_1d8;
      local_1f0 = in_stack_fffffffffffffce8;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_20,local_1e0);
      if ((long)*pvVar3 <= (long)pbVar8) break;
      while (pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_20,local_1e0),
            local_1f0 < *pvVar3) {
        in_stack_fffffffffffffcc8 = local_1d8;
        in_stack_fffffffffffffcd0 = local_8;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_20,local_1e0);
        local_200 = (long)in_stack_fffffffffffffcd0 /
                    ((long)in_stack_fffffffffffffcc8 * (long)*pvVar3);
        local_208 = local_200 - (long)local_168;
        for (; local_1f8 <= local_208; local_1f8 = local_1f8 + 2) {
          lVar7 = (long)&(local_168->sieve_).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start + local_1f8;
          bVar1 = primesum::BitSieve::operator[]
                            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
          lVar7 = lVar7 * (ulong)bVar1;
          pvVar6 = std::vector<long,_std::allocator<long>_>::operator[](&local_138,local_180);
          *pvVar6 = lVar7 + *pvVar6;
        }
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_20,local_1e0);
        lVar7 = (long)*pvVar3 * (long)local_1d8;
        pvVar6 = std::vector<long,_std::allocator<long>_>::operator[](&local_138,local_180);
        local_150 = lVar7 * *pvVar6 + local_150;
        local_1e0 = local_1e0 - 1;
      }
      for (; local_1f8 < (long)local_170 - (long)local_168; local_1f8 = local_1f8 + 2) {
        lVar7 = (long)&(local_168->sieve_).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start + local_1f8;
        bVar1 = primesum::BitSieve::operator[](in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
        pvVar6 = std::vector<long,_std::allocator<long>_>::operator[](&local_138,local_180);
        *pvVar6 = lVar7 * (ulong)bVar1 + *pvVar6;
      }
      in_stack_fffffffffffffc70 = local_168;
      in_stack_fffffffffffffc78 = local_170;
      in_stack_fffffffffffffc80 = local_1d8;
      primesum::Wheel::operator[]((Wheel *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      cross_off(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                (int64_t)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                in_stack_fffffffffffffc50);
    }
LAB_00146ce9:
    local_168 = (BitSieve *)
                ((long)&(local_168->sieve_).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start + local_d0);
  } while( true );
}

Assistant:

int64_t S2(int64_t x,
           int64_t y,
           int64_t c,
           vector<int32_t>& primes,
           vector<int32_t>& lpf,
           vector<int32_t>& mu)
{
  int64_t limit = x / y + 1;
  int64_t segment_size = next_power_of_2(isqrt(limit));
  int64_t pi_y = pi_bsearch(primes, y);
  int64_t S2_result = 0;

  vector<char> sieve(segment_size);
  vector<int64_t> next(primes.begin(), primes.end());
  vector<int64_t> phi(primes.size(), 0);

  // Segmented sieve of Eratosthenes
  for (int64_t low = 1; low < limit; low += segment_size)
  {
    fill(sieve.begin(), sieve.end(), 1);

    // Current segment = interval [low, high[
    int64_t high = min(low + segment_size, limit);

    // phi(y, b) nodes with b <= c do not contribute to S2, so we
    // simply sieve out the multiples of the first c primes
    for (int64_t b = 1; b <= c; b++)
    {
      int64_t k = next[b];
      for (int64_t prime = primes[b]; k < high; k += prime)
        sieve[k - low] = 0;
      next[b] = k;
    }

    for (int64_t b = c + 1; b < pi_y; b++)
    {
      int64_t prime = primes[b];
      int64_t min_m = max(x / (prime * high), y / prime);
      int64_t max_m = min(x / (prime * low), y);
      int64_t i = 0;

      // Obviously if (prime >= max_m) then (prime >= lpf[max_m])
      // if so then (prime < lpf[m]) will always evaluate to
      // false and no special leaves are possible
      if (prime >= max_m)
        break;

      for (int64_t m = max_m; m > min_m; m--)
      {
        if (mu[m] != 0 && prime < lpf[m])
        {
          int64_t xn = x / (prime * m);
          int64_t stop = xn - low;

          for (; i <= stop; i++)
            phi[b] += (low + i) * sieve[i];

          S2_result -= mu[m] * m * prime * phi[b];
        }
      }

      for (; i < high - low; i++)
        phi[b] += (low + i) * sieve[i];

      // Remove the multiples of (b)th prime
      cross_off(prime, low, high, next[b], sieve);
    }
  }

  return S2_result;
}